

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::FileDescriptorTables::AddFieldByStylizedNames
          (FileDescriptorTables *this,FieldDescriptor *field)

{
  long lVar1;
  void *pvVar2;
  PointerStringPair camelcase_key;
  PointerStringPair lowercase_key;
  FieldDescriptor *local_48;
  pair<const_void_*,_const_char_*> local_40;
  pair<const_void_*,_const_char_*> local_30;
  
  lVar1 = 0x38;
  if (field[0x34] == (FieldDescriptor)0x1) {
    pvVar2 = *(void **)(field + 0x40);
    if (pvVar2 != (void *)0x0) goto LAB_001cb020;
    lVar1 = 0x20;
  }
  pvVar2 = *(void **)(field + lVar1);
LAB_001cb020:
  local_30.second = (char *)**(undefined8 **)(field + 0x10);
  local_48 = field;
  local_30.first = pvVar2;
  InsertIfNotPresent<google::protobuf::hash_map<std::pair<void_const*,char_const*>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,google::protobuf::(anonymous_namespace)::PointerStringPairEqual>,std::pair<void_const*,char_const*>,google::protobuf::FieldDescriptor_const*>
            (&this->fields_by_lowercase_name_,&local_30,&local_48);
  local_40.second = (char *)**(undefined8 **)(field + 0x18);
  local_40.first = pvVar2;
  InsertIfNotPresent<google::protobuf::hash_map<std::pair<void_const*,char_const*>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,google::protobuf::(anonymous_namespace)::PointerStringPairEqual>,std::pair<void_const*,char_const*>,google::protobuf::FieldDescriptor_const*>
            (&this->fields_by_camelcase_name_,&local_40,&local_48);
  return;
}

Assistant:

void FileDescriptorTables::AddFieldByStylizedNames(
    const FieldDescriptor* field) {
  const void* parent;
  if (field->is_extension()) {
    if (field->extension_scope() == NULL) {
      parent = field->file();
    } else {
      parent = field->extension_scope();
    }
  } else {
    parent = field->containing_type();
  }

  PointerStringPair lowercase_key(parent, field->lowercase_name().c_str());
  InsertIfNotPresent(&fields_by_lowercase_name_, lowercase_key, field);

  PointerStringPair camelcase_key(parent, field->camelcase_name().c_str());
  InsertIfNotPresent(&fields_by_camelcase_name_, camelcase_key, field);
}